

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string_view __thiscall
google::protobuf::Reflection::GetStringView
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  ReflectionSchema *this_00;
  void *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  CppStringType CVar4;
  Cord **ppCVar5;
  ArenaStringPtr *pAVar6;
  string *psVar7;
  Cord *cord;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Descriptor *expected;
  Metadata MVar8;
  string_view sVar9;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection == this) {
    expected = this->descriptor_;
    if (field->containing_type_ == expected) {
      if (0xbf < (byte)field->field_0x1) {
        expected = this->descriptor_;
        description = "Field is repeated; the method requires a singular field.";
        goto LAB_0027c24f;
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetStringView",CPPTYPE_STRING);
      }
      this_00 = &this->schema_;
      if ((field->field_0x1 & 8) != 0) {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
        psVar7 = internal::ExtensionSet::GetString
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                            field->number_,(field->field_22).default_value_string_);
        goto LAB_0027c1e2;
      }
      bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
      if (bVar2) {
        if ((field->field_0x1 & 0x10) == 0) {
          oneof_descriptor = (OneofDescriptor *)0x0;
        }
        else {
          oneof_descriptor = (field->scope_).containing_oneof;
          if (oneof_descriptor == (OneofDescriptor *)0x0) {
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xa9a);
          }
        }
        uVar3 = GetOneofCase(this,message,oneof_descriptor);
        if (uVar3 == field->number_) goto LAB_0027c194;
      }
      else {
LAB_0027c194:
        CVar4 = FieldDescriptor::cpp_string_type(field);
        if (CVar4 == kCord) {
          bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
          if (bVar2) {
            ppCVar5 = GetRaw<absl::lts_20240722::Cord*>(this,message,field);
            cord = *ppCVar5;
          }
          else {
            cord = GetRaw<absl::lts_20240722::Cord>(this,message,field);
          }
          sVar9 = ScratchSpace::CopyFromCord(scratch,cord);
          return sVar9;
        }
        pAVar6 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        pvVar1 = (pAVar6->tagged_ptr_).ptr_;
        if (((ulong)pvVar1 & 3) != 0) {
          psVar7 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
          goto LAB_0027c1e2;
        }
      }
      psVar7 = (field->field_22).default_value_string_;
LAB_0027c1e2:
      sVar9._M_str = (psVar7->_M_dataplus)._M_p;
      sVar9._M_len = psVar7->_M_string_length;
      return sVar9;
    }
  }
  else {
    expected = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar8.descriptor,field,"GetStringView");
  }
  description = "Field does not match message type.";
LAB_0027c24f:
  anon_unknown_6::ReportReflectionUsageError(expected,field,"GetStringView",description);
}

Assistant:

absl::string_view Reflection::GetStringView(const Message& message,
                                            const FieldDescriptor* field,
                                            ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetStringView, SINGULAR, STRING);

  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  }
  if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    return field->default_value_string();
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      const auto& cord = schema_.InRealOneof(field)
                             ? *GetField<absl::Cord*>(message, field)
                             : GetField<absl::Cord>(message, field);
      return scratch.CopyFromCord(cord);
    }
    default:
      auto str = GetField<ArenaStringPtr>(message, field);
      return str.IsDefault() ? field->default_value_string() : str.Get();
  }
}